

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_voxel_meshify.h
# Opt level: O1

void ogt_stream_from_paletted_voxels_simple
               (uint8_t *voxels,uint32_t size_x,uint32_t size_y,uint32_t size_z,
               ogt_mesh_rgba *palette,ogt_voxel_simple_stream_func stream_func,
               void *stream_func_data)

{
  byte bVar1;
  ogt_mesh_rgba oVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  long lVar7;
  uint32_t *puVar8;
  ogt_mesh_vertex *poVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  uint32_t local_index [36];
  ogt_mesh_vertex local_vertex [24];
  
  if (stream_func == (ogt_voxel_simple_stream_func)0x0) {
    __assert_fail("stream_func",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_voxel_meshify.h"
                  ,0x24b,
                  "void ogt_stream_from_paletted_voxels_simple(const uint8_t *, uint32_t, uint32_t, uint32_t, const ogt_mesh_rgba *, ogt_voxel_simple_stream_func, void *)"
                 );
  }
  if (0 < (int)size_z) {
    uVar4 = 0;
    uVar10 = 0;
    do {
      fVar20 = (float)(int)uVar10;
      fVar21 = fVar20 + 1.0;
      if (0 < (int)size_y) {
        uVar11 = 0;
        do {
          fVar22 = (float)(int)uVar11;
          fVar23 = fVar22 + 1.0;
          if (0 < (int)size_x) {
            lVar7 = 0;
            do {
              if ((ulong)voxels[lVar7] != 0) {
                uVar6 = (uint32_t)lVar7;
                fVar18 = (float)(int)uVar6;
                fVar19 = fVar18 + 1.0;
                bVar13 = true;
                bVar12 = true;
                if (uVar6 != 0) {
                  bVar12 = voxels[lVar7 + -1] == '\0';
                }
                if (-size_x + uVar6 != -1) {
                  bVar13 = voxels[lVar7 + 1] == '\0';
                }
                bVar15 = true;
                bVar14 = true;
                if (uVar11 != 0) {
                  bVar14 = voxels[lVar7 + (int)-size_x] == '\0';
                }
                if (uVar11 != size_y - 1) {
                  bVar15 = voxels[lVar7 + (int)size_x] == '\0';
                }
                bVar17 = true;
                bVar16 = true;
                if (uVar10 != 0) {
                  bVar16 = voxels[lVar7 + (int)-(size_y * size_x)] == '\0';
                }
                if (uVar10 != size_z - 1) {
                  bVar17 = voxels[lVar7 + (int)(size_y * size_x)] == '\0';
                }
                iVar3 = (uint)bVar14 + (uint)bVar15 + (uint)bVar13 + (uint)bVar12 + (uint)bVar16 +
                        (uint)bVar17;
                if (iVar3 != 0) {
                  oVar2 = palette[voxels[lVar7]];
                  if (bVar12 == 0) {
                    puVar8 = local_index;
                    poVar9 = local_vertex;
                    uVar5 = uVar4;
                  }
                  else {
                    local_vertex[0].pos.y = fVar22;
                    local_vertex[0].pos.x = fVar18;
                    local_vertex[0].normal.x = -1.0;
                    local_vertex[0].normal.y = 0.0;
                    local_vertex[0].normal.z = 0.0;
                    local_vertex[0].palette_index = (uint32_t)voxels[lVar7];
                    local_vertex[1].pos.y = fVar23;
                    local_vertex[1].pos.x = fVar18;
                    local_vertex[1].normal.x = -1.0;
                    local_vertex[1].normal.y = 0.0;
                    local_vertex[1].normal.z = 0.0;
                    local_vertex[1].palette_index = (uint32_t)voxels[lVar7];
                    local_vertex[2].pos.y = fVar23;
                    local_vertex[2].pos.x = fVar18;
                    local_vertex[2].normal.x = -1.0;
                    local_vertex[2].normal.y = 0.0;
                    local_vertex[2].normal.z = 0.0;
                    local_vertex[2].palette_index = (uint32_t)voxels[lVar7];
                    local_vertex[3].pos.y = fVar22;
                    local_vertex[3].pos.x = fVar18;
                    local_vertex[3].normal.x = -1.0;
                    local_vertex[3].normal.y = 0.0;
                    local_vertex[3].normal.z = 0.0;
                    local_vertex[3].palette_index = (uint32_t)voxels[lVar7];
                    local_index[0] = uVar4 + 2;
                    local_index[1] = uVar4 + 1;
                    local_index[4] = uVar4 + 3;
                    puVar8 = local_index + 6;
                    poVar9 = local_vertex + 4;
                    uVar5 = uVar4 + 4;
                    local_index[2] = uVar4;
                    local_index[3] = uVar4;
                    local_index[5] = local_index[0];
                    local_vertex[0].pos.z = fVar20;
                    local_vertex[0].color = oVar2;
                    local_vertex[1].pos.z = fVar20;
                    local_vertex[1].color = oVar2;
                    local_vertex[2].pos.z = fVar21;
                    local_vertex[2].color = oVar2;
                    local_vertex[3].pos.z = fVar21;
                    local_vertex[3].color = oVar2;
                  }
                  if (bVar13 != 0) {
                    bVar1 = voxels[lVar7];
                    (poVar9->pos).x = fVar19;
                    (poVar9->pos).y = fVar22;
                    (poVar9->pos).z = fVar20;
                    (poVar9->normal).x = 1.0;
                    (poVar9->normal).y = 0.0;
                    (poVar9->normal).z = 0.0;
                    poVar9->color = oVar2;
                    poVar9->palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[1].pos.x = fVar19;
                    poVar9[1].pos.y = fVar23;
                    poVar9[1].pos.z = fVar20;
                    poVar9[1].normal.x = 1.0;
                    poVar9[1].normal.y = 0.0;
                    poVar9[1].normal.z = 0.0;
                    poVar9[1].color = oVar2;
                    poVar9[1].palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[2].pos.x = fVar19;
                    poVar9[2].pos.y = fVar23;
                    poVar9[2].pos.z = fVar21;
                    poVar9[2].normal.x = 1.0;
                    poVar9[2].normal.y = 0.0;
                    poVar9[2].normal.z = 0.0;
                    poVar9[2].color = oVar2;
                    poVar9[2].palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[3].pos.x = fVar19;
                    poVar9[3].pos.y = fVar22;
                    poVar9[3].pos.z = fVar21;
                    poVar9[3].normal.x = 1.0;
                    poVar9[3].normal.y = 0.0;
                    poVar9[3].normal.z = 0.0;
                    poVar9[3].color = oVar2;
                    poVar9[3].palette_index = (uint)bVar1;
                    *puVar8 = uVar5;
                    puVar8[1] = uVar5 + 1;
                    puVar8[2] = uVar5 + 2;
                    puVar8[3] = uVar5 + 2;
                    puVar8[4] = uVar5 + 3;
                    puVar8[5] = uVar5;
                    uVar5 = uVar5 + 4;
                    poVar9 = poVar9 + 4;
                    puVar8 = puVar8 + 6;
                  }
                  if (bVar14 != false) {
                    bVar1 = voxels[lVar7];
                    (poVar9->pos).x = fVar18;
                    (poVar9->pos).y = fVar22;
                    (poVar9->pos).z = fVar20;
                    (poVar9->normal).x = 0.0;
                    (poVar9->normal).y = -1.0;
                    (poVar9->normal).z = 0.0;
                    poVar9->color = oVar2;
                    poVar9->palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[1].pos.x = fVar19;
                    poVar9[1].pos.y = fVar22;
                    poVar9[1].pos.z = fVar20;
                    poVar9[1].normal.x = 0.0;
                    poVar9[1].normal.y = -1.0;
                    poVar9[1].normal.z = 0.0;
                    poVar9[1].color = oVar2;
                    poVar9[1].palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[2].pos.x = fVar19;
                    poVar9[2].pos.y = fVar22;
                    poVar9[2].pos.z = fVar21;
                    poVar9[2].normal.x = 0.0;
                    poVar9[2].normal.y = -1.0;
                    poVar9[2].normal.z = 0.0;
                    poVar9[2].color = oVar2;
                    poVar9[2].palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[3].pos.x = fVar18;
                    poVar9[3].pos.y = fVar22;
                    poVar9[3].pos.z = fVar21;
                    poVar9[3].normal.x = 0.0;
                    poVar9[3].normal.y = -1.0;
                    poVar9[3].normal.z = 0.0;
                    poVar9[3].color = oVar2;
                    poVar9[3].palette_index = (uint)bVar1;
                    *puVar8 = uVar5;
                    puVar8[1] = uVar5 + 1;
                    puVar8[2] = uVar5 + 2;
                    puVar8[3] = uVar5 + 2;
                    puVar8[4] = uVar5 + 3;
                    puVar8[5] = uVar5;
                    uVar5 = uVar5 + 4;
                    poVar9 = poVar9 + 4;
                    puVar8 = puVar8 + 6;
                  }
                  if (bVar15 != false) {
                    bVar1 = voxels[lVar7];
                    (poVar9->pos).x = fVar18;
                    (poVar9->pos).y = fVar23;
                    (poVar9->pos).z = fVar20;
                    (poVar9->normal).x = 0.0;
                    (poVar9->normal).y = 1.0;
                    (poVar9->normal).z = 0.0;
                    poVar9->color = oVar2;
                    poVar9->palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[1].pos.x = fVar19;
                    poVar9[1].pos.y = fVar23;
                    poVar9[1].pos.z = fVar20;
                    poVar9[1].normal.x = 0.0;
                    poVar9[1].normal.y = 1.0;
                    poVar9[1].normal.z = 0.0;
                    poVar9[1].color = oVar2;
                    poVar9[1].palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[2].pos.x = fVar19;
                    poVar9[2].pos.y = fVar23;
                    poVar9[2].pos.z = fVar21;
                    poVar9[2].normal.x = 0.0;
                    poVar9[2].normal.y = 1.0;
                    poVar9[2].normal.z = 0.0;
                    poVar9[2].color = oVar2;
                    poVar9[2].palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[3].pos.x = fVar18;
                    poVar9[3].pos.y = fVar23;
                    poVar9[3].pos.z = fVar21;
                    poVar9[3].normal.x = 0.0;
                    poVar9[3].normal.y = 1.0;
                    poVar9[3].normal.z = 0.0;
                    poVar9[3].color = oVar2;
                    poVar9[3].palette_index = (uint)bVar1;
                    *puVar8 = uVar5 + 2;
                    puVar8[1] = uVar5 + 1;
                    puVar8[2] = uVar5;
                    puVar8[3] = uVar5;
                    puVar8[4] = uVar5 + 3;
                    puVar8[5] = uVar5 + 2;
                    uVar5 = uVar5 + 4;
                    poVar9 = poVar9 + 4;
                    puVar8 = puVar8 + 6;
                  }
                  if (bVar16 != 0) {
                    bVar1 = voxels[lVar7];
                    (poVar9->pos).x = fVar18;
                    (poVar9->pos).y = fVar22;
                    (poVar9->pos).z = fVar20;
                    (poVar9->normal).x = 0.0;
                    (poVar9->normal).y = 0.0;
                    (poVar9->normal).z = -1.0;
                    poVar9->color = oVar2;
                    poVar9->palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[1].pos.x = fVar19;
                    poVar9[1].pos.y = fVar22;
                    poVar9[1].pos.z = fVar20;
                    poVar9[1].normal.x = 0.0;
                    poVar9[1].normal.y = 0.0;
                    poVar9[1].normal.z = -1.0;
                    poVar9[1].color = oVar2;
                    poVar9[1].palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[2].pos.x = fVar19;
                    poVar9[2].pos.y = fVar23;
                    poVar9[2].pos.z = fVar20;
                    poVar9[2].normal.x = 0.0;
                    poVar9[2].normal.y = 0.0;
                    poVar9[2].normal.z = -1.0;
                    poVar9[2].color = oVar2;
                    poVar9[2].palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[3].pos.x = fVar18;
                    poVar9[3].pos.y = fVar23;
                    poVar9[3].pos.z = fVar20;
                    poVar9[3].normal.x = 0.0;
                    poVar9[3].normal.y = 0.0;
                    poVar9[3].normal.z = -1.0;
                    poVar9[3].color = oVar2;
                    poVar9[3].palette_index = (uint)bVar1;
                    *puVar8 = uVar5 + 2;
                    puVar8[1] = uVar5 + 1;
                    puVar8[2] = uVar5;
                    puVar8[3] = uVar5;
                    puVar8[4] = uVar5 + 3;
                    puVar8[5] = uVar5 + 2;
                    uVar5 = uVar5 + 4;
                    poVar9 = poVar9 + 4;
                    puVar8 = puVar8 + 6;
                  }
                  if (bVar17 != false) {
                    bVar1 = voxels[lVar7];
                    (poVar9->pos).x = fVar18;
                    (poVar9->pos).y = fVar22;
                    (poVar9->pos).z = fVar21;
                    (poVar9->normal).x = 0.0;
                    (poVar9->normal).y = 0.0;
                    (poVar9->normal).z = 1.0;
                    poVar9->color = oVar2;
                    poVar9->palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[1].pos.x = fVar19;
                    poVar9[1].pos.y = fVar22;
                    poVar9[1].pos.z = fVar21;
                    poVar9[1].normal.x = 0.0;
                    poVar9[1].normal.y = 0.0;
                    poVar9[1].normal.z = 1.0;
                    poVar9[1].color = oVar2;
                    poVar9[1].palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[2].pos.x = fVar19;
                    poVar9[2].pos.y = fVar23;
                    poVar9[2].pos.z = fVar21;
                    poVar9[2].normal.x = 0.0;
                    poVar9[2].normal.y = 0.0;
                    poVar9[2].normal.z = 1.0;
                    poVar9[2].color = oVar2;
                    poVar9[2].palette_index = (uint)bVar1;
                    bVar1 = voxels[lVar7];
                    poVar9[3].pos.x = fVar18;
                    poVar9[3].pos.y = fVar23;
                    poVar9[3].pos.z = fVar21;
                    poVar9[3].normal.x = 0.0;
                    poVar9[3].normal.y = 0.0;
                    poVar9[3].normal.z = 1.0;
                    poVar9[3].color = oVar2;
                    poVar9[3].palette_index = (uint)bVar1;
                    *puVar8 = uVar5;
                    puVar8[1] = uVar5 + 1;
                    puVar8[2] = uVar5 + 2;
                    puVar8[3] = uVar5 + 2;
                    puVar8[4] = uVar5 + 3;
                    puVar8[5] = uVar5;
                    uVar5 = uVar5 + 4;
                  }
                  (*stream_func)(uVar6,uVar11,uVar10,local_vertex,iVar3 * 4,local_index,iVar3 * 6,
                                 stream_func_data);
                  uVar4 = uVar5;
                }
              }
              lVar7 = lVar7 + 1;
            } while ((uint32_t)lVar7 != size_x);
            voxels = voxels + lVar7;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != size_y);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != size_z);
  }
  return;
}

Assistant:

void ogt_stream_from_paletted_voxels_simple(
    const uint8_t* voxels, uint32_t size_x, uint32_t size_y, uint32_t size_z, const ogt_mesh_rgba* palette,
    ogt_voxel_simple_stream_func stream_func, void* stream_func_data) 
{
    assert(stream_func);
    const int32_t k_stride_x = 1;
    const int32_t k_stride_y = size_x;
    const int32_t k_stride_z = size_x * size_y;
    const int32_t k_max_x = size_x - 1;
    const int32_t k_max_y = size_y - 1;
    const int32_t k_max_z = size_z - 1;
    
    const uint8_t* current_voxel = voxels;

    uint32_t total_vertex_count = 0;
    uint32_t total_index_count = 0;
    for (int32_t k = 0; k < (int32_t)size_z; k++)
    {
        const float min_z = (float)k;
        const float max_z = min_z + 1.0f;
        for (int32_t j = 0; j < (int32_t)size_y; j++)
        {
            const float min_y = (float)j;
            const float max_y = min_y + 1.0f;
            for (int32_t i = 0; i < (int32_t)size_x; i++, current_voxel++)
            {
                // current voxel slot is empty? skip it.
                if (current_voxel[0] == 0)
                    continue;

                ogt_mesh_rgba color = palette[ current_voxel[0]];
                
                // determine the min/max coords of the voxel for each dimension.
                const float min_x = (float)i;
                const float max_x = min_x + 1.0f;

                // determine which faces we need to generate
                uint32_t neg_x = ((i == 0)       || (current_voxel[-k_stride_x] == 0));
                uint32_t pos_x = ((i == k_max_x) || (current_voxel[ k_stride_x] == 0));
                uint32_t neg_y = ((j == 0)       || (current_voxel[-k_stride_y] == 0));
                uint32_t pos_y = ((j == k_max_y) || (current_voxel[ k_stride_y] == 0));
                uint32_t neg_z = ((k == 0)       || (current_voxel[-k_stride_z] == 0));
                uint32_t pos_z = ((k == k_max_z) || (current_voxel[ k_stride_z] == 0));

                // count the number of faces. skip if zero.
                const uint32_t face_count_needed = (neg_x + pos_x + neg_y + pos_y + neg_z + pos_z);
                if (!face_count_needed)
                    continue;

                // generate geometry for this voxel to a local buffer first.
                ogt_mesh_vertex  local_vertex[24];
                uint32_t         local_index[36];
                ogt_mesh_vertex* current_vertex = local_vertex;
                uint32_t*        current_index  = local_index;

                // -X direction face
                if (neg_x)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, min_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( min_x, max_y, min_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( min_x, max_y, max_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, min_y, max_z, -1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 2;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 0;
                    current_index[3] = total_vertex_count + 0;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 2;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                
                // +X direction face
                if (pos_x)
                {
                    current_vertex[0] = _mesh_make_vertex( max_x, min_y, min_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, max_y, min_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, max_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( max_x, min_y, max_z, 1.0f, 0.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 0;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 2;
                    current_index[3] = total_vertex_count + 2;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 0;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                
                // -Y direction face
                if (neg_y)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, min_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, min_y, min_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, min_y, max_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, min_y, max_z, 0.0f,-1.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 0;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 2;
                    current_index[3] = total_vertex_count + 2;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 0;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                // +Y direction face
                if (pos_y)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, max_y, min_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, max_y, min_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, max_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, max_y, max_z, 0.0f, 1.0f, 0.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 2;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 0;
                    current_index[3] = total_vertex_count + 0;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 2;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
               }
                // -Z direction face
                if (neg_z)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, min_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, max_y, min_z, 0.0f, 0.0f,-1.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 2;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 0;
                    current_index[3] = total_vertex_count + 0;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 2;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }
                // +Z direction face
                if (pos_z)
                {
                    current_vertex[0] = _mesh_make_vertex( min_x, min_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_vertex[1] = _mesh_make_vertex( max_x, min_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_vertex[2] = _mesh_make_vertex( max_x, max_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_vertex[3] = _mesh_make_vertex( min_x, max_y, max_z, 0.0f, 0.0f, 1.0f, color, current_voxel[0] );
                    current_index[0] = total_vertex_count + 0;
                    current_index[1] = total_vertex_count + 1;
                    current_index[2] = total_vertex_count + 2;
                    current_index[3] = total_vertex_count + 2;
                    current_index[4] = total_vertex_count + 3;
                    current_index[5] = total_vertex_count + 0;
                    total_vertex_count += 4;
                    total_index_count  += 6;
                    current_vertex += 4;
                    current_index += 6;
                }

                // geometry for this voxel is provided to a caller-specified stream function/callback
                stream_func(i, j, k, local_vertex, face_count_needed*4, local_index, face_count_needed*6, stream_func_data);
            }
        }
    }	

}